

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

bool __thiscall
GlobOpt::IsImplicitCallBailOutCurrentlyNeeded
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,BasicBlock *block,
          bool hasLiveFields,bool mayNeedImplicitCallBailOut,bool isForwardPass,
          bool mayNeedLazyBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  
  if (isForwardPass && mayNeedLazyBailOut) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x562,"(!isForwardPass || !mayNeedLazyBailOut)",
                       "!isForwardPass || !mayNeedLazyBailOut");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((!mayNeedImplicitCallBailOut) ||
     (bVar2 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0), bVar2 && !mayNeedLazyBailOut))
  goto LAB_0048df62;
  bVar2 = NeedBailOnImplicitCallForLiveValues(this,block,isForwardPass);
  if ((!bVar2) &&
     (((bVar2 = NeedBailOnImplicitCallForCSE(block,isForwardPass), !bVar2 &&
       (bVar2 = NeedBailOnImplicitCallWithFieldOpts(this,block->loop,hasLiveFields), !bVar2)) &&
      (bVar2 = NeedBailOnImplicitCallForArrayCheckHoist(this,block,isForwardPass), !bVar2)))) {
    if ((instr->field_0x38 & 0x10) == 0) {
      if (!mayNeedLazyBailOut) goto LAB_0048df62;
    }
    else {
      BVar3 = IR::Instr::GetBailOutKind(instr);
      if (((byte)(BVar3 >> 0x1e) & 1) == 0 && !mayNeedLazyBailOut) goto LAB_0048df62;
    }
  }
  bVar2 = IR::Instr::HasTypeCheckBailOut(instr);
  if ((!bVar2) && (bVar2 = MayNeedBailOnImplicitCall(instr,src1Val,src2Val), bVar2)) {
    return true;
  }
LAB_0048df62:
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutAtEveryImplicitCallFlag);
  if (((bVar2) && ((instr->field_0x38 & 0x10) == 0)) &&
     (bVar2 = MayNeedBailOnImplicitCall(instr,(Value *)0x0,(Value *)0x0), bVar2)) {
    return true;
  }
  return false;
}

Assistant:

bool
GlobOpt::IsImplicitCallBailOutCurrentlyNeeded(IR::Instr * instr, Value const * src1Val, Value const * src2Val, BasicBlock const * block,
    bool hasLiveFields, bool mayNeedImplicitCallBailOut, bool isForwardPass, bool mayNeedLazyBailOut) const
{
    // We use BailOnImplicitCallPreOp for fixed field optimization in place of LazyBailOut when
    // an instruction already has a preop bailout. This function is called both from the forward
    // and backward passes to check if implicit bailout is needed and use the result to insert/remove
    // bailout. In the backward pass, we would want to override the decision to not
    // use implicit call to true when we need lazy bailout so that the bailout isn't removed.
    // In the forward pass, however, we don't want to influence the result. So make sure that
    // mayNeedLazyBailOut is false when we are in the forward pass.
    Assert(!isForwardPass || !mayNeedLazyBailOut);

    if (mayNeedImplicitCallBailOut &&

        // If we know that we are calling an accessor, don't insert bailout on implicit calls
        // because we will bail out anyway. However, with fixed field optimization we still
        // want the bailout to prevent any side effects from happening.
        (!instr->CallsAccessor() || mayNeedLazyBailOut) &&
        (
            NeedBailOnImplicitCallForLiveValues(block, isForwardPass) ||
            NeedBailOnImplicitCallForCSE(block, isForwardPass) ||
            NeedBailOnImplicitCallWithFieldOpts(block->loop, hasLiveFields) ||
            NeedBailOnImplicitCallForArrayCheckHoist(block, isForwardPass) ||
            (instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutMarkTempObject) != 0) ||
            mayNeedLazyBailOut
        ) &&
        (!instr->HasTypeCheckBailOut() && MayNeedBailOnImplicitCall(instr, src1Val, src2Val)))
    {
        return true;
    }

#if DBG
    if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryImplicitCallFlag) &&
        !instr->HasBailOutInfo() && MayNeedBailOnImplicitCall(instr, nullptr, nullptr))
    {
        // always add implicit call bailout even if we don't need it, but only on opcode that supports it
        return true;
    }
#endif

    return false;
}